

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void setupMain(void)

{
  object *poVar1;
  object *proc_00;
  object *poVar2;
  typeDesc *ptVar3;
  typeDesc *ptVar4;
  typeDesc *type;
  typeDesc *tp;
  object *it;
  object *secondParam;
  object *firstParam;
  object *proc;
  
  proc_00 = newAnonymousObj(0x2c0);
  stringCopy("main",proc_00->name);
  proc_00->retTypeIndex = intTypeIndex;
  proc_00->hasArguments = 1;
  proc_00->hasPrototype = 1;
  openScope();
  poVar1 = topScope;
  poVar2 = (object *)calloc(1,0x90);
  stringCopy("argc",poVar2->name);
  poVar2->typeIndex = intTypeIndex;
  poVar2->next = poVar1->next;
  poVar1->next = poVar2;
  poVar2->cl = 0x2c1;
  poVar2->lev = 1;
  poVar2->val = 0x14;
  poVar1 = poVar1->next;
  poVar2 = (object *)calloc(1,0x90);
  stringCopy("argv",poVar2->name);
  ptVar3 = newType();
  ptVar3->form = 0x322;
  ptVar4 = getType(charTypeIndex);
  ptVar3->base = ptVar4;
  ptVar3->size = 0xc;
  poVar2->typeIndex = ptVar3->index;
  poVar2->cl = 0x2c5;
  poVar2->next = poVar1->next;
  poVar1->next = poVar2;
  poVar2->lev = 1;
  poVar2->val = 8;
  addProcToFixList(5,proc_00);
  proc_00->dsc = topScope;
  closeScope();
  return;
}

Assistant:

procedure
void setupMain(void) {
	variable struct object *proc; variable struct object *firstParam; 
	variable struct object *secondParam; variable struct object *it;
	variable struct typeDesc *tp; variable struct typeDesc *type;
	proc = newAnonymousObj(CLASS_PROC);
	stringCopy("main",proc->name);
	proc->retTypeIndex = intTypeIndex;
	proc->hasArguments = true;
	proc->hasPrototype = true;

	openScope();
	it = topScope;

	/* setup argc */
	allocMem(firstParam);
	stringCopy("argc", firstParam->name);
	firstParam->typeIndex = intTypeIndex;
	firstParam->next = it->next; it->next = firstParam;
	firstParam->cl = CLASS_VAR; /* value */
	firstParam->lev = 1; /* local */
	firstParam->val = 20;
	it = it->next;

	/* setup argv */
	allocMem(secondParam);
	stringCopy("argv", secondParam->name);
	tp = newType();
	tp->form = FORM_ARRAY;
	type = getType(charTypeIndex);
	tp->base = type;
	tp->size = wordSize + 8;
	secondParam->typeIndex = tp->index;
	secondParam->cl = CLASS_PAR; 
	secondParam->next = it->next; it->next = secondParam;
	secondParam->lev = 1;
	secondParam->val = 8;
	it = it->next;
	
	addProcToFixList(ENTRY,proc);

	/* set dsc to HEAD of inner scope */
	proc->dsc = topScope;
	closeScope();
	

}